

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_visible(REF_CAVITY ref_cavity,REF_INT face,REF_BOOL *visible)

{
  REF_NODE ref_node;
  REF_INT *pRVar1;
  uint uVar2;
  long lVar3;
  REF_DBL volume;
  REF_INT nodes [27];
  double local_90;
  REF_INT local_88;
  REF_INT local_84;
  REF_INT local_80;
  REF_INT local_7c;
  
  ref_node = ref_cavity->ref_grid->node;
  *visible = 0;
  pRVar1 = ref_cavity->f2n;
  lVar3 = (long)(face * 3);
  local_88 = pRVar1[lVar3];
  local_84 = pRVar1[lVar3 + 1];
  local_80 = pRVar1[lVar3 + 2];
  local_7c = ref_cavity->node;
  uVar2 = ref_node_tet_vol(ref_node,&local_88,&local_90);
  if (uVar2 == 0) {
    uVar2 = 0;
    if (ref_node->min_volume < local_90) {
      *visible = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x765,
           "ref_cavity_visible",(ulong)uVar2,"norm");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_visible(REF_CAVITY ref_cavity, REF_INT face,
                                      REF_BOOL *visible) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL volume;

  *visible = REF_FALSE;

  nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
  nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
  nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
  nodes[3] = ref_cavity_node(ref_cavity);

  RSS(ref_node_tet_vol(ref_node, nodes, &volume), "norm");

  if (volume <= ref_node_min_volume(ref_node)) return REF_SUCCESS;

  *visible = REF_TRUE;

  return REF_SUCCESS;
}